

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O3

ASN1_OBJECT * ASN1_OBJECT_create(int nid,uchar *data,int len,char *sn,char *ln)

{
  ASN1_OBJECT *pAVar1;
  undefined4 in_register_00000014;
  ASN1_OBJECT o;
  ASN1_OBJECT local_30;
  
  if (CONCAT44(in_register_00000014,len) >> 0x1f == 0) {
    local_30.flags = 0xd;
    local_30.sn = sn;
    local_30.ln = (char **)ln;
    local_30.nid = nid;
    local_30.length = len;
    local_30.data = data;
    pAVar1 = OBJ_dup(&local_30);
  }
  else {
    pAVar1 = (ASN1_OBJECT *)0x0;
    ERR_put_error(0xc,0,0xad,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                  ,0xb4);
  }
  return pAVar1;
}

Assistant:

ASN1_OBJECT *ASN1_OBJECT_create(int nid, const unsigned char *data, size_t len,
                                const char *sn, const char *ln) {
  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_STRING_TOO_LONG);
    return NULL;
  }

  ASN1_OBJECT o;
  o.sn = sn;
  o.ln = ln;
  o.data = data;
  o.nid = nid;
  o.length = (int)len;
  o.flags = ASN1_OBJECT_FLAG_DYNAMIC | ASN1_OBJECT_FLAG_DYNAMIC_STRINGS |
            ASN1_OBJECT_FLAG_DYNAMIC_DATA;
  return OBJ_dup(&o);
}